

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O2

bool duckdb::GreaterThanEquals::Operation<float>(float *left,float *right)

{
  bool bVar1;
  
  bVar1 = GreaterThanEqualsFloat<float>(*left,*right);
  return bVar1;
}

Assistant:

bool GreaterThanEquals::Operation(const float &left, const float &right) {
	return GreaterThanEqualsFloat<float>(left, right);
}